

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndCell(ImGuiTable *table)

{
  float fVar1;
  int iVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiWindow *pIVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  
  iVar2 = table->CurrentColumn;
  pIVar3 = (table->Columns).Data;
  pIVar4 = table->InnerWindow;
  if ((pIVar4->DC).IsSetPos == true) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  lVar5 = 0x48;
  if ((table->field_0x98 & 1) == 0) {
    lVar5 = (ulong)table->IsUnfrozenRows * 4 + 0x40;
  }
  fVar7 = *(float *)((long)&pIVar3[iVar2].Flags + lVar5);
  fVar1 = (pIVar4->DC).CursorMaxPos.x;
  uVar6 = -(uint)(fVar1 <= fVar7);
  *(uint *)((long)&pIVar3[iVar2].Flags + lVar5) = ~uVar6 & (uint)fVar1 | (uint)fVar7 & uVar6;
  fVar7 = (pIVar4->DC).CursorMaxPos.y + table->CellPaddingY;
  uVar6 = -(uint)(fVar7 <= table->RowPosY2);
  table->RowPosY2 = (float)(uVar6 & (uint)table->RowPosY2 | ~uVar6 & (uint)fVar7);
  pIVar3[iVar2].ItemWidth = (pIVar4->DC).ItemWidth;
  fVar7 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar6 = -(uint)(fVar7 <= table->RowTextBaseline);
  table->RowTextBaseline = (float)(~uVar6 & (uint)fVar7 | (uint)table->RowTextBaseline & uVar6);
  return;
}

Assistant:

void ImGui::TableEndCell(ImGuiTable* table)
{
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];
    ImGuiWindow* window = table->InnerWindow;

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Report maximum position so we can infer content size per column.
    float* p_max_pos_x;
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
        p_max_pos_x = &column->ContentMaxXHeadersUsed;  // Useful in case user submit contents in header row that is not a TableHeader() call
    else
        p_max_pos_x = table->IsUnfrozenRows ? &column->ContentMaxXUnfrozen : &column->ContentMaxXFrozen;
    *p_max_pos_x = ImMax(*p_max_pos_x, window->DC.CursorMaxPos.x);
    table->RowPosY2 = ImMax(table->RowPosY2, window->DC.CursorMaxPos.y + table->CellPaddingY);
    column->ItemWidth = window->DC.ItemWidth;

    // Propagate text baseline for the entire row
    // FIXME-TABLE: Here we propagate text baseline from the last line of the cell.. instead of the first one.
    table->RowTextBaseline = ImMax(table->RowTextBaseline, window->DC.PrevLineTextBaseOffset);
}